

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

void __thiscall
tchecker::details::extract_variables_visitor_t::extract_variable_with_type
          (extract_variables_visitor_t *this,variable_id_t id,expression_type_t type)

{
  invalid_argument *this_00;
  variable_id_t local_14;
  expression_type_t type_local;
  variable_id_t id_local;
  extract_variables_visitor_t *this_local;
  
  local_14 = id;
  _type_local = this;
  if ((type == EXPR_TYPE_INTVAR) || (type == EXPR_TYPE_INTARRAY)) {
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(this->_intvars,&local_14);
  }
  else {
    if ((type != EXPR_TYPE_CLKVAR) && (type != EXPR_TYPE_CLKARRAY)) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"typed expression is not well-typed");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert(this->_clocks,&local_14);
  }
  return;
}

Assistant:

void extract_variable_with_type(tchecker::variable_id_t id, enum tchecker::expression_type_t type)
  {
    if ((type == tchecker::EXPR_TYPE_INTVAR) || (type == tchecker::EXPR_TYPE_INTARRAY))
      _intvars.insert(id);
    else if ((type == tchecker::EXPR_TYPE_CLKVAR) || (type == tchecker::EXPR_TYPE_CLKARRAY))
      _clocks.insert(id);
    else
      throw std::invalid_argument("typed expression is not well-typed");
  }